

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_NodeRef_rec(Gia_Man_t *p,Gia_Obj_t *pNode,int fMark)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_34;
  int Counter;
  Gia_Obj_t *pFanin;
  int fMark_local;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  local_34 = 0;
  iVar1 = Gia_ObjIsCi(pNode);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pNode);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                    ,0x456,"int Gia_NodeRef_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    if (fMark != 0) {
      Gia_ObjSetTravIdCurrent(p,pNode);
    }
    pGVar2 = Gia_ObjFanin0(pNode);
    iVar1 = Gia_ObjRefInc(p,pGVar2);
    if (iVar1 == 0) {
      local_34 = Gia_NodeRef_rec(p,pGVar2,fMark);
    }
    pGVar2 = Gia_ObjFanin1(pNode);
    iVar1 = Gia_ObjRefInc(p,pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_NodeRef_rec(p,pGVar2,fMark);
      local_34 = iVar1 + local_34;
    }
    p_local._4_4_ = local_34 + 1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_NodeRef_rec( Gia_Man_t * p, Gia_Obj_t * pNode, int fMark )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    if ( fMark ) Gia_ObjSetTravIdCurrent(p, pNode);
    pFanin = Gia_ObjFanin0(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    pFanin = Gia_ObjFanin1(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    return Counter + 1;
}